

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
NEST::NESTcalc::GetBoyleModelDT(void)

{
  double (*__range1) [25] [2];
  double (*iP) [2];
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *in_RDI;
  long lVar1;
  double modelDT [25] [2];
  double local_1a8 [50];
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  memcpy(local_1a8,&DAT_00115630,400);
  for (lVar1 = 0; lVar1 != 400; lVar1 = lVar1 + 0x10) {
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double_const&,double_const&>
              (in_RDI,(double *)((long)local_1a8 + lVar1),(double *)((long)local_1a8 + lVar1 + 8));
  }
  return (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)in_RDI;
}

Assistant:

std::vector<std::pair<double, double> > NESTcalc::GetBoyleModelDT() {
  std::vector<std::pair<double, double> > output;
  const int nPts = 25;
  constexpr double modelDT[nPts][2] = {
      {14.6236, 24.674},  {24.5646, 26.4954}, {36.675, 29.2043},
      {53.4802, 32.6845}, {74.3939, 37.9944}, {111.071, 45.3424},
      {173.835, 58.2226}, {306.106, 74.6236}, {467.921, 89.2124},
      {749.809, 96.9913}, {1093.38, 98.4549}, {1711.25, 97.3852},
      {2615.85, 92.5493}, {3998.65, 85.4419}, {6258.24, 78.2405},
      {9794.71, 67.7294}, {16453.1, 58.544},  {27637.8, 50.3599},
      {38445.7, 48.5424}, {49828.3, 43.4695}, {70967.5, 36.8038},
      {98719.8, 32.7631}, {127948, 29.5377},  {169785, 27.4412},
      {220053, 27.9686}};
  for (auto &iP : modelDT) {
    output.emplace_back(iP[0], iP[1]);
  }
  return output;
}